

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

void elf_dynreloc(ObjectUnit *ou,Reloc *r,int relafmt,size_t elfrelsize)

{
  Symbol *sym_00;
  Section *pSVar1;
  ObjectUnit *in_RCX;
  int in_EDX;
  long in_RSI;
  uint8_t in_DIL;
  bool unaff_retaddr;
  Symbol *sym;
  uint8_t dynflag;
  Section **secp;
  char *secname;
  undefined8 in_stack_ffffffffffffffc0;
  undefined2 uVar2;
  undefined7 in_stack_ffffffffffffffc8;
  byte bVar3;
  Section **in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  uVar2 = (undefined2)((ulong)in_stack_ffffffffffffffc0 >> 0x30);
  bVar3 = 0x40;
  switch(*(undefined1 *)(in_RSI + 0x38)) {
  case 1:
    return;
  default:
    ierror("elf_dynreloc(): wrong rtype %s (%d)",reloc_name[*(byte *)(in_RSI + 0x38)],
           (ulong)*(byte *)(in_RSI + 0x38));
    break;
  case 0xe:
    bVar3 = 0x80;
  case 6:
  case 0xd:
    in_stack_ffffffffffffffd0 = &elfdynrelocs;
    in_stack_ffffffffffffffd8 = dynrel_name[(int)(uint)(in_EDX != 0)];
    *(byte *)(in_RSI + 0x39) = *(byte *)(in_RSI + 0x39) | 0x80;
    break;
  case 0xf:
    in_stack_ffffffffffffffd0 = &elfpltrelocs;
    in_stack_ffffffffffffffd8 = pltrel_name[(int)(uint)(in_EDX != 0)];
    *(byte *)(in_RSI + 0x39) = *(byte *)(in_RSI + 0x39) | 0x40;
  }
  if (*in_stack_ffffffffffffffd0 == (Section *)0x0) {
    pSVar1 = add_section(in_RCX,in_stack_ffffffffffffffd8,(uint8_t *)in_stack_ffffffffffffffd0,
                         CONCAT17(bVar3,in_stack_ffffffffffffffc8),(uint8_t)((ushort)uVar2 >> 8),
                         (uint8_t)uVar2,(uint8_t)in_RSI,in_DIL,unaff_retaddr);
    *in_stack_ffffffffffffffd0 = pSVar1;
  }
  (*in_stack_ffffffffffffffd0)->size = (long)&(in_RCX->n).next + (*in_stack_ffffffffffffffd0)->size;
  if ((*(long *)(in_RSI + 0x10) != 0) &&
     (sym_00 = *(Symbol **)(in_RSI + 0x18), (sym_00->flags & 0xc0) == 0)) {
    sym_00->flags = sym_00->flags | bVar3;
    elf_adddynsym(sym_00);
  }
  return;
}

Assistant:

void elf_dynreloc(struct ObjectUnit *ou,struct Reloc *r,int relafmt,
                  size_t elfrelsize)
{
  const char *secname;
  struct Section **secp;
  uint8_t dynflag = SYMF_DYNIMPORT;

  switch (r->rtype) {
    case R_COPY:
      dynflag = SYMF_DYNEXPORT;
      /* fall through */
    case R_GLOBDAT:
    case R_LOADREL:
      secp = &elfdynrelocs;
      secname = dynrel_name[relafmt?1:0];
      r->flags |= RELF_DYN;
      break;
    case R_JMPSLOT:
      secp = &elfpltrelocs;
      secname = pltrel_name[relafmt?1:0];
      r->flags |= RELF_PLT;
      break;
    case R_ABS:
      return;
    default:
      ierror("elf_dynreloc(): wrong rtype %s (%d)",
             reloc_name[r->rtype],(int)r->rtype);
      break;
  }

  /* make sure that dynamic relocation section exists */
  if (*secp == NULL)
    *secp = add_section(ou,secname,NULL,0,ST_DATA,SF_ALLOC,SP_READ,2,TRUE);

  /* increase size for new entry */
  (*secp)->size += elfrelsize;
  
  /* allocate referenced symbol in .dynsym and .dynstr */
  if (r->xrefname) {
    struct Symbol *sym = r->relocsect.symbol;

    if (!(sym->flags & SYMF_DYNLINK)) {
      /* add symbol to .dynsym symbol list, if not already present */
      sym->flags |= dynflag;
      elf_adddynsym(sym);
    }
  }
}